

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

int getEncodingIndex(char *name)

{
  int iVar1;
  long lVar2;
  char **ppcVar3;
  
  if (name == (char *)0x0) {
    lVar2 = 6;
  }
  else {
    ppcVar3 = getEncodingIndex::encodingNames;
    lVar2 = 0;
    do {
      iVar1 = streqci(name,*ppcVar3);
      if (iVar1 != 0) goto LAB_006d44f3;
      lVar2 = lVar2 + 1;
      ppcVar3 = ppcVar3 + 1;
    } while (lVar2 != 6);
    lVar2 = 0xffffffff;
  }
LAB_006d44f3:
  return (int)lVar2;
}

Assistant:

static int FASTCALL
getEncodingIndex(const char *name) {
  static const char *const encodingNames[] = {
      KW_ISO_8859_1, KW_US_ASCII, KW_UTF_8, KW_UTF_16, KW_UTF_16BE, KW_UTF_16LE,
  };
  int i;
  if (name == NULL)
    return NO_ENC;
  for (i = 0; i < (int)(sizeof(encodingNames) / sizeof(encodingNames[0])); i++)
    if (streqci(name, encodingNames[i]))
      return i;
  return UNKNOWN_ENC;
}